

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall Nova::Timer::Release_Timer(Timer *this,int id)

{
  int local_14;
  Timer *pTStack_10;
  int id_local;
  Timer *this_local;
  
  local_14 = id;
  pTStack_10 = this;
  Identity_Array::Append(this->free_timers,&local_14);
  return;
}

Assistant:

void Release_Timer(const int id)
    {free_timers->Append(id);}